

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdhelpers.c
# Opt level: O0

char * gd_strtok_r(char *s,char *sep,char **state)

{
  char *result;
  char separators [256];
  char **state_local;
  char *sep_local;
  char *s_local;
  
  separators._248_8_ = state;
  memset(&result,0,0x100);
  for (state_local = (char **)sep; *(char *)state_local != '\0';
      state_local = (char **)((long)state_local + 1)) {
    separators[(ulong)*(byte *)state_local - 8] = '\x01';
  }
  sep_local = s;
  if (s == (char *)0x0) {
    sep_local = *(char **)separators._248_8_;
  }
  if (*sep_local == '\0') {
    *(char **)separators._248_8_ = sep_local;
    s_local = (char *)0x0;
  }
  else {
    s_local = sep_local;
    if (separators[(ulong)(byte)*sep_local - 8] != '\0') {
      do {
        sep_local = sep_local + 1;
      } while (separators[(ulong)(byte)*sep_local - 8] != '\0');
      s_local = sep_local;
      if (*sep_local == 0) {
        *(char **)separators._248_8_ = sep_local;
        return (char *)0x0;
      }
    }
    do {
      if (*sep_local == '\0') {
        *(char **)separators._248_8_ = sep_local;
        return (char *)(byte *)s_local;
      }
      sep_local = sep_local + 1;
    } while (separators[(ulong)(byte)*sep_local - 8] == '\0');
    *sep_local = 0;
    do {
      sep_local = sep_local + 1;
    } while (separators[(ulong)(byte)*sep_local - 8] != '\0');
    *(char **)separators._248_8_ = sep_local;
  }
  return s_local;
}

Assistant:

char *
gd_strtok_r (char *s, char *sep, char **state)
{
	char separators[256];
	char *result = 0;
	memset (separators, 0, sizeof (separators));
	while (*sep) {
		separators[*((unsigned char *) sep)] = 1;
		sep++;
	}
	if (!s) {
		/* Pick up where we left off */
		s = *state;
	}
	/* 1. EOS */
	if (!(*s)) {
		*state = s;
		return 0;
	}
	/* 2. Leading separators, if any */
	if (SEP_TEST) {
		do {
			s++;
		} while (SEP_TEST);
		/* 2a. EOS after separators only */
		if (!(*s)) {
			*state = s;
			return 0;
		}
	}
	/* 3. A token */
	result = s;
	do {
		/* 3a. Token at end of string */
		if (!(*s)) {
			*state = s;
			return result;
		}
		s++;
	} while (!SEP_TEST);
	/* 4. Terminate token and skip trailing separators */
	*s = '\0';
	do {
		s++;
	} while (SEP_TEST);
	/* 5. Return token */
	*state = s;
	return result;
}